

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O1

size_t xmi_process_chunks(PBuffer *buffer,MidiFile *midi)

{
  undefined4 uVar1;
  code *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RAX;
  long lVar5;
  Stream *pSVar6;
  iterator iVar7;
  Logger *pLVar8;
  element_type *_size;
  anon_union_4_2_7f9ed247 source;
  string name;
  anon_union_4_2_7f9ed247 dest;
  PBuffer id;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ostream *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  _func_int **local_48;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  _size = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (_size->size != 0) {
    in_RAX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buffer;
    local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buffer;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)midi;
    do {
      local_e0 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RAX._M_pi)->_M_use_count)->
                 _M_pi;
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
        }
      }
      Buffer::pop((Buffer *)&stack0xffffffffffffffb8,(size_t)_size);
      local_c8._0_8_ = local_c8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,local_48[3],local_48[4] + (long)local_48[3]);
      uVar1 = *(undefined4 *)_size->read;
      _size->read = _size->read + 4;
      if (_size->endianess == EndianessBig) {
        local_d8._0_4_ = uVar1;
        lVar5 = 4;
        pLVar8 = (Logger *)local_98;
        do {
          *(undefined1 *)&pLVar8->_vptr_Logger = *(undefined1 *)((long)&local_e0 + lVar5 + 7);
          pLVar8 = (Logger *)((long)&pLVar8->_vptr_Logger + 1);
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      local_68 = (ostream *)&local_58;
      local_58 = 0x32696d78;
      local_60 = 7;
      uStack_54 = 0x64696d;
      Log::Logger::operator[]((Logger *)local_d8,(string *)&Log::Verbose);
      pSVar6 = Log::Stream::operator<<((Stream *)local_d8,"Processing XMI chunk: ");
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->stream,(char *)local_c8._0_8_,local_c8._8_8_);
      pSVar6 = Log::Stream::operator<<(pSVar6," (size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)pSVar6->stream);
      Log::Stream::operator<<(pSVar6,")");
      Log::Stream::~Stream((Stream *)local_d8);
      if (local_68 != (ostream *)&local_58) {
        operator_delete(local_68,CONCAT44(uStack_54,local_58) + 1);
      }
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>_>_>
              ::find(&xmi_processors_abi_cxx11_._M_t,(key_type *)local_c8);
      if ((_Rb_tree_header *)iVar7._M_node ==
          &xmi_processors_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        Buffer::pop((Buffer *)local_d8,(size_t)_size);
        if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        local_88._M_p = (pointer)&local_78;
        local_78._M_allocated_capacity._0_4_ = 0x32696d78;
        local_80 = 7;
        local_78._M_allocated_capacity._4_4_ = 0x64696d;
        Log::Logger::operator[]((Logger *)local_98,(string *)&Log::Debug);
        pSVar6 = Log::Stream::operator<<((Stream *)local_98,"Unknown XMI chunk: ");
        std::ostream::_M_insert<void_const*>(pSVar6->stream);
        Log::Stream::~Stream((Stream *)local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_p != &local_78) {
          operator_delete(local_88._M_p,
                          CONCAT44(local_78._M_allocated_capacity._4_4_,
                                   local_78._M_allocated_capacity._0_4_) + 1);
        }
      }
      else {
        Buffer::pop((Buffer *)local_d8,(size_t)_size);
        pcVar2 = *(code **)(iVar7._M_node + 2);
        local_98._0_8_ = CONCAT44(local_d8._4_4_,local_d8._0_4_);
        local_98._8_8_ = local_d8._8_8_;
        if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                     super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                          super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                     super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                          super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          }
        }
        (*pcVar2)((Logger *)local_98,local_38._M_pi);
        if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
      }
      if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if (local_40 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
      }
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
      }
      in_RAX._M_pi = local_a0._M_pi;
      Buffer::get_tail((Buffer *)local_c8,
                       (size_t)((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)
                               &(local_a0._M_pi)->_vptr__Sp_counted_base)->_M_ptr);
      uVar4 = local_c8._8_8_;
      uVar3 = local_c8._0_8_;
      local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8._8_8_ = (element_type *)0x0;
      this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RAX._M_pi)->_M_use_count)->_M_pi;
      ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&(in_RAX._M_pi)->_vptr__Sp_counted_base)
      ->_M_ptr = (element_type *)uVar3;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RAX._M_pi)->_M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        in_RAX._M_pi = local_a0._M_pi;
      }
      if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        in_RAX._M_pi = local_a0._M_pi;
      }
      _size = ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)
              &(in_RAX._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
    } while (_size->size != 0);
  }
  return (size_t)in_RAX._M_pi;
}

Assistant:

static size_t
xmi_process_chunks(PBuffer buffer, MidiFile *midi) {
  size_t length = buffer->get_size();

  while (buffer->get_size()) {
    size_t size = xmi_process_chunk(buffer, midi);
    buffer = buffer->get_tail(size);
  }

  return length;
}